

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Record.h
# Opt level: O0

void __thiscall
KDIS::UTILS::DIS_Logger_Record::Record<unsigned_int>
          (DIS_Logger_Record *this,uint Stamp,KDataStream *Stream)

{
  ostream *poVar1;
  KString local_220;
  byte local_1f9;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1a8 [8];
  KStringStream ss;
  ostream local_198 [376];
  KDataStream *local_20;
  KDataStream *Stream_local;
  DIS_Logger_Record *pDStack_10;
  uint Stamp_local;
  DIS_Logger_Record *this_local;
  
  local_20 = Stream;
  Stream_local._4_4_ = Stamp;
  pDStack_10 = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = (ostream *)std::ostream::operator<<(local_198,Stream_local._4_4_);
  poVar1 = std::operator<<(poVar1,"\n");
  KDataStream::GetAsString_abi_cxx11_(&local_1d8,local_20);
  std::operator<<(poVar1,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  local_1f9 = 0;
  if ((this->m_bWriteToFile & 1U) == 0) {
    std::__cxx11::stringstream::str();
    writeToBuffer(this,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  else {
    std::__cxx11::stringstream::str();
    local_1f9 = 1;
    writeToFile(this,&local_1f8);
  }
  if ((local_1f9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void DIS_Logger_Record::Record(Type Stamp, const KDataStream &Stream) noexcept(false)
{
    KStringStream ss;
    ss << Stamp << "\n" << Stream.GetAsString();
    m_bWriteToFile ? writeToFile( ss.str() ) : writeToBuffer( ss.str() );
}